

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void SerializeMany<VectorWriter,int,unsigned_long,long,unsigned_long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,std::__cxx11::string,int,bool>
               (VectorWriter *s,int *args,unsigned_long *args_1,long *args_2,unsigned_long *args_3,
               ParamsWrapper<CNetAddr::SerParams,_CService> *args_4,unsigned_long *args_5,
               ParamsWrapper<CNetAddr::SerParams,_CService> *args_6,unsigned_long *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,int *args_9
               ,bool *args_10)

{
  uint8_t f;
  long *__n;
  long in_FS_OFFSET;
  unsigned_long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = CONCAT44(local_40._4_4_,*args);
  __n = args_2;
  VectorWriter::write(s,(int)&local_40,(void *)0x4,(size_t)args_2);
  local_40 = *args_1;
  VectorWriter::write(s,(int)&local_40,&DAT_00000008,(size_t)__n);
  local_40 = *args_2;
  VectorWriter::write(s,(int)&local_40,&DAT_00000008,(size_t)__n);
  local_40 = *args_3;
  VectorWriter::write(s,(int)&local_40,&DAT_00000008,(size_t)__n);
  ParamsWrapper<CNetAddr::SerParams,_CService>::Serialize<VectorWriter>(args_4,s);
  local_40 = *args_5;
  VectorWriter::write(s,(int)&local_40,&DAT_00000008,(size_t)__n);
  ParamsWrapper<CNetAddr::SerParams,_CService>::Serialize<VectorWriter>(args_6,s);
  local_40 = *args_7;
  VectorWriter::write(s,(int)&local_40,&DAT_00000008,(size_t)__n);
  Serialize<VectorWriter,char>(s,args_8);
  local_40 = CONCAT44(local_40._4_4_,*args_9);
  VectorWriter::write(s,(int)&local_40,(void *)0x4,(size_t)__n);
  local_40 = CONCAT71(local_40._1_7_,*args_10);
  VectorWriter::write(s,(int)&local_40,(void *)0x1,(size_t)__n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}